

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::DefaultAtomVisitor::visit(DefaultAtomVisitor *this,DirectionalAtom *datom)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  element_type *peVar4;
  element_type *genData;
  Atom *in_RSI;
  long in_RDI;
  RealType RVar5;
  MultipoleAdapter ma;
  GayBerneAdapter gba;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atype;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::AtomData> atomData;
  string *in_stack_fffffffffffffca8;
  AtomType *in_stack_fffffffffffffcb0;
  StuntDouble *in_stack_fffffffffffffcb8;
  Vector<double,_3U> *in_stack_fffffffffffffcd0;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffcd8;
  StuntDouble *this_00;
  undefined4 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcec;
  undefined1 in_stack_fffffffffffffced;
  undefined1 in_stack_fffffffffffffcef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  string *this_01;
  Atom *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  shared_ptr<OpenMD::GenericData> local_2b8 [2];
  allocator<char> local_291;
  string local_290 [24];
  Atom *in_stack_fffffffffffffd88;
  BaseAtomVisitor *in_stack_fffffffffffffd90;
  MultipoleAdapter local_f8;
  GayBerneAdapter local_f0 [4];
  FluctuatingChargeAdapter local_d0;
  FixedChargeAdapter local_c8 [10];
  string local_78 [48];
  undefined4 local_48;
  AtomType *local_38;
  Atom *local_10;
  
  local_10 = in_RSI;
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x346df4);
  std::shared_ptr<OpenMD::AtomInfo>::shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x346e01);
  local_38 = Atom::getAtomType(local_10);
  bVar1 = BaseAtomVisitor::isVisited
                    ((BaseAtomVisitor *)
                     CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                     in_stack_fffffffffffffd28);
  if (bVar1) {
    local_48 = 1;
  }
  else {
    std::make_shared<OpenMD::AtomInfo>();
    std::shared_ptr<OpenMD::AtomInfo>::operator=
              ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffcb0,
               (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffca8);
    std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x346eb5);
    (*(local_10->super_StuntDouble)._vptr_StuntDouble[7])(local_78);
    peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x346edd);
    this_01 = local_78;
    std::__cxx11::string::operator=((string *)peVar4,this_01);
    std::__cxx11::string::~string(this_01);
    iVar3 = StuntDouble::getGlobalIndex(&local_10->super_StuntDouble);
    peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x346f1c);
    peVar4->globalID = iVar3;
    StuntDouble::getPos(in_stack_fffffffffffffcb8);
    std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x346f47);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffcb0,
               (Vector3<double> *)in_stack_fffffffffffffca8);
    StuntDouble::getVel(in_stack_fffffffffffffcb8);
    std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x346f81);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffcb0,
               (Vector3<double> *)in_stack_fffffffffffffca8);
    StuntDouble::getFrc(in_stack_fffffffffffffcb8);
    std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x346fbb);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffcb0,
               (Vector3<double> *)in_stack_fffffffffffffca8);
    peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x346fe3);
    peVar4->hasVelocity = true;
    peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x346ff4);
    peVar4->hasForce = true;
    peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x347005);
    peVar4->hasGlobalID = true;
    FixedChargeAdapter::FixedChargeAdapter(local_c8,local_38);
    bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x347030);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x34704d);
      peVar4->hasCharge = true;
      RVar5 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_fffffffffffffcb0);
      peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x347076);
      peVar4->charge = RVar5;
    }
    FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_d0,local_38);
    bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x3470a8);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3470c5);
      peVar4->hasCharge = true;
      in_stack_fffffffffffffcf0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           StuntDouble::getFlucQPos((StuntDouble *)in_stack_fffffffffffffcb0);
      peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3470ee);
      peVar4->charge = (double)in_stack_fffffffffffffcf0 + peVar4->charge;
    }
    if (((*(uint *)(in_RDI + 0x30) & 0x1000) != 0) &&
       (in_stack_fffffffffffffcef = AtomType::isElectrostatic(in_stack_fffffffffffffcb0),
       (bool)in_stack_fffffffffffffcef)) {
      peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x347143);
      peVar4->hasElectricField = true;
      StuntDouble::getElectricField(in_stack_fffffffffffffcb8);
      std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x34716e);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffcb0,
                 (Vector3<double> *)in_stack_fffffffffffffca8);
    }
    GayBerneAdapter::GayBerneAdapter(local_f0,local_38);
    MultipoleAdapter::MultipoleAdapter(&local_f8,local_38);
    uVar2 = GayBerneAdapter::isGayBerne((GayBerneAdapter *)0x3471c4);
    if ((bool)uVar2) {
      peVar4 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3471e4);
      peVar4->hasVector = true;
      StuntDouble::getA(in_stack_fffffffffffffcb8);
      SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffffcd8);
      OpenMD::operator*(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x347244);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffcb8,
                 (Vector<double,_3U> *)in_stack_fffffffffffffcb0);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x347267);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x347274);
    }
    else {
      in_stack_fffffffffffffced = MultipoleAdapter::isDipole((MultipoleAdapter *)this_01);
      if ((bool)in_stack_fffffffffffffced) {
        peVar4 = std::
                 __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3472ec);
        peVar4->hasVector = true;
        StuntDouble::getDipole(in_stack_fffffffffffffcb8);
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x347317);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffcb0,
                   (Vector3<double> *)in_stack_fffffffffffffca8);
      }
      else {
        in_stack_fffffffffffffcec = MultipoleAdapter::isQuadrupole((MultipoleAdapter *)this_01);
        if ((bool)in_stack_fffffffffffffcec) {
          peVar4 = std::
                   __shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34735f);
          peVar4->hasVector = true;
          StuntDouble::getA(in_stack_fffffffffffffcb8);
          SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffffcd8);
          OpenMD::operator*(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
          std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3473bf);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffcb8,
                     (Vector<double,_3U> *)in_stack_fffffffffffffcb0);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3473e2);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3473ef);
        }
      }
    }
    std::make_shared<OpenMD::AtomData>();
    std::shared_ptr<OpenMD::AtomData>::operator=
              ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffcb0,
               (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffca8);
    std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x347476);
    genData = std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x347480);
    this_00 = (StuntDouble *)&local_291;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcf0,
               (char *)CONCAT17(in_stack_fffffffffffffcef,
                                CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffced,
                                                        CONCAT14(in_stack_fffffffffffffcec,
                                                                 in_stack_fffffffffffffce8)))),
               (allocator<char> *)this_00);
    GenericData::setID((GenericData *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3474ed);
    std::shared_ptr<OpenMD::AtomInfo>::shared_ptr
              ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffcb0,
               (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffca8);
    AtomData::addAtomInfo
              ((AtomData *)in_stack_fffffffffffffcb0,
               (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffca8);
    std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34752a);
    std::shared_ptr<OpenMD::GenericData>::shared_ptr<OpenMD::AtomData,void>
              (local_2b8,(shared_ptr<OpenMD::AtomData> *)local_10);
    StuntDouble::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)genData);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34756d);
    BaseAtomVisitor::setVisited(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_48 = 0;
  }
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34759c);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x3475a9);
  return;
}

Assistant:

void DefaultAtomVisitor::visit(DirectionalAtom* datom) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    AtomType* atype = datom->getAtomType();

    if (isVisited(datom)) return;

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = datom->getType();
    atomInfo->globalID     = datom->getGlobalIndex();
    atomInfo->pos          = datom->getPos();
    atomInfo->vel          = datom->getVel();
    atomInfo->frc          = datom->getFrc();
    atomInfo->hasVelocity  = true;
    atomInfo->hasForce     = true;
    atomInfo->hasGlobalID  = true;

    FixedChargeAdapter fca = FixedChargeAdapter(atype);
    if (fca.isFixedCharge()) {
      atomInfo->hasCharge = true;
      atomInfo->charge    = fca.getCharge();
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
    if (fqa.isFluctuatingCharge()) {
      atomInfo->hasCharge = true;
      atomInfo->charge += datom->getFlucQPos();
    }

    if ((storageLayout_ & DataStorage::dslElectricField) &&
        (atype->isElectrostatic())) {
      atomInfo->hasElectricField = true;
      atomInfo->eField           = datom->getElectricField();
    }

    GayBerneAdapter gba = GayBerneAdapter(atype);
    MultipoleAdapter ma = MultipoleAdapter(atype);

    if (gba.isGayBerne()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getA().transpose() * V3Z;
    } else if (ma.isDipole()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getDipole();
    } else if (ma.isQuadrupole()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getA().transpose() * V3Z;
    }

    atomData = std::make_shared<AtomData>();
    atomData->setID("ATOMDATA");
    atomData->addAtomInfo(atomInfo);

    datom->addProperty(atomData);

    setVisited(datom);
  }